

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

bool __thiscall
llama_model_loader::get_key<bool>(llama_model_loader *this,llm_kv kid,bool *result,bool required)

{
  bool bVar1;
  string local_40;
  
  LLM_KV::operator()[abi_cxx11_(&local_40,&this->llm_kv,kid);
  bVar1 = get_key<bool>(this,&local_40,result,required);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key(enum llm_kv kid, T & result, bool required) {
        return get_key(llm_kv(kid), result, required);
    }